

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O0

void __thiscall DisplayNCurses::DisplayNCurses(DisplayNCurses *this,int refreshSeconds)

{
  int refreshSeconds_local;
  DisplayNCurses *this_local;
  
  Display::Display(&this->super_Display);
  (this->super_Display)._vptr_Display = (_func_int **)&PTR_render_0012fbe0;
  this->_refreshSecs = refreshSeconds;
  initscr();
  cbreak();
  noecho();
  keypad(_stdscr,1);
  return;
}

Assistant:

DisplayNCurses::DisplayNCurses(int refreshSeconds)
    : _refreshSecs(refreshSeconds) {
#if HAVE_GUI
  // Init ncurses.
  initscr();
  cbreak();
  noecho();
  keypad(stdscr, TRUE);
#endif
}